

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlistwidget.cpp
# Opt level: O2

QListWidgetItem * __thiscall QListWidget::itemFromIndex(QListWidget *this,QModelIndex *index)

{
  QListWidgetPrivate *this_00;
  bool bVar1;
  QListModel *pQVar2;
  
  this_00 = *(QListWidgetPrivate **)
             &(this->super_QListView).super_QAbstractItemView.super_QAbstractScrollArea.super_QFrame
              .super_QWidget.field_0x8;
  bVar1 = QAbstractItemViewPrivate::isIndexValid((QAbstractItemViewPrivate *)this_00,index);
  if (bVar1) {
    pQVar2 = QListWidgetPrivate::listModel(this_00);
    if ((ulong)(long)index->r < (ulong)(pQVar2->items).d.size) {
      return (pQVar2->items).d.ptr[index->r];
    }
  }
  return (QListWidgetItem *)0x0;
}

Assistant:

QListWidgetItem *QListWidget::itemFromIndex(const QModelIndex &index) const
{
    Q_D(const QListWidget);
    if (d->isIndexValid(index))
        return d->listModel()->at(index.row());
    return nullptr;
}